

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O0

void __thiscall
GuillotineBinPack::Insert
          (GuillotineBinPack *this,TArray<RectSize,_RectSize> *rects,TArray<Rect,_Rect> *dst,
          bool merge,FreeRectChoiceHeuristic rectChoice,GuillotineSplitHeuristic splitMethod)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  RectSize *pRVar6;
  Rect *pRVar7;
  undefined1 local_5c [8];
  Rect newNode;
  int score_1;
  int score;
  uint j;
  uint i;
  int bestScore;
  uint uStack_30;
  bool bestFlipped;
  int bestRect;
  int bestFreeRect;
  GuillotineSplitHeuristic splitMethod_local;
  FreeRectChoiceHeuristic rectChoice_local;
  bool merge_local;
  TArray<Rect,_Rect> *dst_local;
  TArray<RectSize,_RectSize> *rects_local;
  GuillotineBinPack *this_local;
  
  TArray<Rect,_Rect>::Clear(dst);
  uStack_30 = 0;
  bestScore = 0;
  bVar3 = false;
  do {
    uVar5 = TArray<RectSize,_RectSize>::Size(rects);
    if (uVar5 == 0) {
      return;
    }
    j = 0x7fffffff;
    for (score = 0; uVar5 = TArray<Rect,_Rect>::Size(&this->freeRectangles), (uint)score < uVar5;
        score = score + 1) {
      for (score_1 = 0; uVar5 = TArray<RectSize,_RectSize>::Size(rects), (uint)score_1 < uVar5;
          score_1 = score_1 + 1) {
        pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
        iVar1 = pRVar6->width;
        pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
        if (iVar1 == pRVar7->width) {
          pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
          iVar1 = pRVar6->height;
          pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
          if (iVar1 == pRVar7->height) {
            uStack_30 = score;
            bestScore = score_1;
            bVar3 = false;
            j = 0x80000000;
            score = TArray<Rect,_Rect>::Size(&this->freeRectangles);
            break;
          }
        }
        pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
        iVar1 = pRVar6->height;
        pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
        if (iVar1 == pRVar7->width) {
          pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
          iVar1 = pRVar6->width;
          pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
          if (iVar1 == pRVar7->height) {
            uStack_30 = score;
            bestScore = score_1;
            bVar3 = true;
            j = 0x80000000;
            score = TArray<Rect,_Rect>::Size(&this->freeRectangles);
            break;
          }
        }
        pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
        iVar1 = pRVar6->width;
        pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
        if (pRVar7->width < iVar1) {
LAB_003aecd7:
          pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
          iVar1 = pRVar6->height;
          pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
          if (iVar1 <= pRVar7->width) {
            pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
            iVar1 = pRVar6->width;
            pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
            if (iVar1 <= pRVar7->height) {
              pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
              iVar1 = pRVar6->height;
              pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
              iVar2 = pRVar6->width;
              pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
              newNode.width = ScoreByHeuristic(iVar1,iVar2,pRVar7,rectChoice);
              if (newNode.width < (int)j) {
                uStack_30 = score;
                bestScore = score_1;
                bVar3 = true;
                j = newNode.width;
              }
            }
          }
        }
        else {
          pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
          iVar1 = pRVar6->height;
          pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
          if (pRVar7->height < iVar1) goto LAB_003aecd7;
          pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
          iVar1 = pRVar6->width;
          pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)score_1);
          iVar2 = pRVar6->height;
          pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)(uint)score);
          newNode.height = ScoreByHeuristic(iVar1,iVar2,pRVar7,rectChoice);
          if (newNode.height < (int)j) {
            uStack_30 = score;
            bestScore = score_1;
            bVar3 = false;
            j = newNode.height;
          }
        }
      }
    }
    if (j == 0x7fffffff) {
      return;
    }
    pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(long)(int)uStack_30);
    local_5c._0_4_ = pRVar7->x;
    pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(long)(int)uStack_30);
    local_5c._4_4_ = pRVar7->y;
    pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(long)bestScore);
    newNode.x = pRVar6->width;
    pRVar6 = TArray<RectSize,_RectSize>::operator[](rects,(long)bestScore);
    newNode.y = pRVar6->height;
    if (bVar3) {
      std::swap<int>(&newNode.x,&newNode.y);
    }
    pRVar7 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(long)(int)uStack_30);
    SplitFreeRectByHeuristic(this,pRVar7,(Rect *)local_5c,splitMethod);
    TArray<Rect,_Rect>::Delete(&this->freeRectangles,uStack_30);
    TArray<RectSize,_RectSize>::Delete(rects,bestScore);
    if (merge) {
      MergeFreeList(this);
    }
    TArray<Rect,_Rect>::Push(&this->usedRectangles,(Rect *)local_5c);
    bVar4 = DisjointRectCollection::Add(&this->disjointRects,(Rect *)local_5c);
    if (!bVar4) {
      __assert_fail("disjointRects.Add(newNode) == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                    ,0x94,
                    "void GuillotineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &, bool, FreeRectChoiceHeuristic, GuillotineSplitHeuristic)"
                   );
    }
  } while( true );
}

Assistant:

void GuillotineBinPack::Insert(TArray<RectSize> &rects, TArray<Rect> &dst, bool merge, 
	FreeRectChoiceHeuristic rectChoice, GuillotineSplitHeuristic splitMethod)
{
	dst.Clear();

	// Remember variables about the best packing choice we have made so far during the iteration process.
	int bestFreeRect = 0;
	int bestRect = 0;
	bool bestFlipped = false;

	// Pack rectangles one at a time until we have cleared the rects array of all rectangles.
	// rects will get destroyed in the process.
	while(rects.Size() > 0)
	{
		// Stores the penalty score of the best rectangle placement - bigger=worse, smaller=better.
		int bestScore = INT_MAX;

		for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		{
			for(unsigned j = 0; j < rects.Size(); ++j)
			{
				// If this rectangle is a perfect match, we pick it instantly.
				if (rects[j].width == freeRectangles[i].width && rects[j].height == freeRectangles[i].height)
				{
					bestFreeRect = i;
					bestRect = j;
					bestFlipped = false;
					bestScore = INT_MIN;
					i = freeRectangles.Size(); // Force a jump out of the outer loop as well - we got an instant fit.
					break;
				}
				// If flipping this rectangle is a perfect match, pick that then.
				else if (rects[j].height == freeRectangles[i].width && rects[j].width == freeRectangles[i].height)
				{
					bestFreeRect = i;
					bestRect = j;
					bestFlipped = true;
					bestScore = INT_MIN;
					i = freeRectangles.Size(); // Force a jump out of the outer loop as well - we got an instant fit.
					break;
				}
				// Try if we can fit the rectangle upright.
				else if (rects[j].width <= freeRectangles[i].width && rects[j].height <= freeRectangles[i].height)
				{
					int score = ScoreByHeuristic(rects[j].width, rects[j].height, freeRectangles[i], rectChoice);
					if (score < bestScore)
					{
						bestFreeRect = i;
						bestRect = j;
						bestFlipped = false;
						bestScore = score;
					}
				}
				// If not, then perhaps flipping sideways will make it fit?
				else if (rects[j].height <= freeRectangles[i].width && rects[j].width <= freeRectangles[i].height)
				{
					int score = ScoreByHeuristic(rects[j].height, rects[j].width, freeRectangles[i], rectChoice);
					if (score < bestScore)
					{
						bestFreeRect = i;
						bestRect = j;
						bestFlipped = true;
						bestScore = score;
					}
				}
			}
		}

		// If we didn't manage to find any rectangle to pack, abort.
		if (bestScore == INT_MAX)
			return;

		// Otherwise, we're good to go and do the actual packing.
		Rect newNode;
		newNode.x = freeRectangles[bestFreeRect].x;
		newNode.y = freeRectangles[bestFreeRect].y;
		newNode.width = rects[bestRect].width;
		newNode.height = rects[bestRect].height;

		if (bestFlipped)
			std::swap(newNode.width, newNode.height);

		// Remove the free space we lost in the bin.
		SplitFreeRectByHeuristic(freeRectangles[bestFreeRect], newNode, splitMethod);
		freeRectangles.Delete(bestFreeRect);

		// Remove the rectangle we just packed from the input list.
		rects.Delete(bestRect);

		// Perform a Rectangle Merge step if desired.
		if (merge)
			MergeFreeList();

		// Remember the new used rectangle.
		usedRectangles.Push(newNode);

		// Check that we're really producing correct packings here.
#ifdef _DEBUG
		assert(disjointRects.Add(newNode) == true);
#endif
	}
}